

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhe25519.h
# Opt level: O0

void random_bytes(void *data,size_t len)

{
  result_type rVar1;
  ulong in_RSI;
  long in_RDI;
  int extra;
  size_t i;
  random_device rd;
  int *alias;
  result_type local_13b8 [4];
  ulong local_13a8;
  random_device *in_stack_ffffffffffffec80;
  long local_8;
  
  local_8 = in_RDI;
  std::random_device::random_device(in_stack_ffffffffffffec80);
  for (local_13a8 = 0; local_13a8 < in_RSI >> 2; local_13a8 = local_13a8 + 1) {
    rVar1 = std::random_device::operator()((random_device *)0x10f53a);
    *(result_type *)((long)&local_8 + local_13a8 * 4) = rVar1;
  }
  if ((in_RSI & 3) != 0) {
    local_13b8[0] = std::random_device::operator()((random_device *)0x10f59a);
    memcpy((void *)((in_RSI & 0xfffffffffffffffc) + local_8),local_13b8,in_RSI & 3);
  }
  std::random_device::~random_device((random_device *)0x10f5e0);
  return;
}

Assistant:

void random_bytes(void* data, size_t len) {
    int* alias = (int *)(&data);
    std::random_device rd;
    for (size_t i = 0; i < len / sizeof(int); ++i)
        alias[i] = rd();

    if (len % sizeof(int) != 0) {
			int extra = rd();
			memcpy((len/sizeof(int)*sizeof(int))+(char *) data, &extra, len%sizeof(4));
		}
}